

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O3

void __thiscall Kernel::KBO::State::traverse<_1,true>(State *this,KBO *kbo,AppliedTerm tt)

{
  uint uVar1;
  uint64_t uVar2;
  SubstApplicator *pSVar3;
  State *pSVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  State *pSVar8;
  int iVar9;
  bool bVar10;
  ulong uVar6;
  
  if (((undefined1  [24])tt & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    recordVariable<_1>(this,(uint)(tt.term._content >> 2));
    return;
  }
  if (traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') {
    traverse<_1,true>();
  }
  if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
    Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
  }
  pSVar8 = traverse<-1,_true>::recState._cursor;
  ((traverse<-1,_true>::recState._cursor)->t).applicator = tt.applicator;
  (pSVar8->t).term._content = tt.term._content;
  (pSVar8->t).aboveVar = tt.aboveVar;
  *(undefined7 *)&(pSVar8->t).field_0x9 = tt._9_7_;
  pSVar8->arg = 0;
  traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
  pSVar8 = traverse<-1,_true>::recState._stack;
  if (traverse<-1,_true>::recState._cursor != traverse<-1,_true>::recState._stack) {
    do {
      pSVar4 = traverse<-1,_true>::recState._cursor;
      uVar1 = traverse<-1,_true>::recState._cursor[-1].arg;
      uVar2 = traverse<-1,_true>::recState._cursor[-1].t.term._content;
      if (uVar1 < (*(uint *)(uVar2 + 0xc) & 0xfffffff)) {
        traverse<-1,_true>::recState._cursor[-1].arg = uVar1 + 1;
        uVar6 = *(ulong *)(uVar2 + 0x28 +
                          ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) - (long)(int)uVar1) * 8);
        bVar10 = pSVar4[-1].t.aboveVar;
        pSVar3 = pSVar4[-1].t.applicator;
        if (((bVar10 & 1U) != 0) && ((uVar6 & 1) != 0)) {
          iVar5 = (*pSVar3->_vptr_SubstApplicator[2])(pSVar3,uVar6 >> 2 & 0xffffffff);
          uVar6 = CONCAT44(extraout_var,iVar5);
          bVar10 = false;
        }
        if ((uVar6 & 1) == 0) {
          uVar7 = uVar6;
          if (*(int *)(uVar6 + 0xc) < 0) {
            iVar5 = 0;
            do {
              uVar7 = *(ulong *)(uVar7 + 0x20);
              if ((uVar7 & 1) != 0) {
                iVar9 = 3;
                goto LAB_0054165c;
              }
              iVar5 = iVar5 + 2;
            } while (*(int *)(uVar7 + 0xc) < 0);
          }
          else {
            iVar5 = 0;
          }
          iVar9 = *(int *)(uVar7 + 0x20);
LAB_0054165c:
          pSVar8 = traverse<-1,_true>::recState._stack;
          if (iVar5 + iVar9 != 0) {
            if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
              Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
            }
            pSVar8 = traverse<-1,_true>::recState._cursor;
            ((traverse<-1,_true>::recState._cursor)->t).term._content = uVar6;
            (pSVar8->t).aboveVar = bVar10;
            (pSVar8->t).applicator = pSVar3;
            pSVar8->arg = 0;
            traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
            pSVar8 = traverse<-1,_true>::recState._stack;
          }
        }
        else {
          recordVariable<_1>(this,(uint)(uVar6 >> 2));
          pSVar8 = traverse<-1,_true>::recState._stack;
        }
      }
      else {
        traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + -1;
      }
    } while (traverse<-1,_true>::recState._cursor != pSVar8);
  }
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}